

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildDescription.cpp
# Opt level: O2

Command * __thiscall
llbuild::buildsystem::BuildDescription::addCommand
          (BuildDescription *this,
          unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
          *value)

{
  Command *pCVar1;
  StringRef Key;
  __uniq_ptr_impl<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
  *this_00;
  
  pCVar1 = (value->_M_t).
           super___uniq_ptr_impl<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
           ._M_t.
           super__Tuple_impl<0UL,_llbuild::buildsystem::Command_*,_std::default_delete<llbuild::buildsystem::Command>_>
           .super__Head_base<0UL,_llbuild::buildsystem::Command_*,_false>._M_head_impl;
  Key.Data = (pCVar1->name)._M_dataplus._M_p;
  Key.Length = (pCVar1->name)._M_string_length;
  this_00 = (__uniq_ptr_impl<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
             *)llvm::
               StringMap<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>,_llvm::MallocAllocator>
               ::operator[](&this->commands,Key);
  std::
  __uniq_ptr_impl<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
  ::operator=(this_00,(__uniq_ptr_impl<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
                       *)value);
  return pCVar1;
}

Assistant:

Command& BuildDescription::addCommand(std::unique_ptr<Command> value) {
  auto& result = *value.get();
  getCommands()[value->getName()] = std::move(value);
  return result;
}